

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O3

string_type *
booster::operator+(string_type *__return_storage_ptr__,string_type *l,sub_match<const_char_*> *r)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  if (r->matched == true) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,(r->super_pair<const_char_*,_const_char_*>).first,
               (r->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_30 = local_20;
    local_28 = 0;
    local_20[0] = 0;
  }
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_30,0,(char *)0x0,(ulong)(l->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

typename sub_match<Iterator>::string_type 
	operator+(typename sub_match<Iterator>::string_type const &l,sub_match<Iterator> const &r)
	{ return l + r.str(); }